

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecCl.c
# Opt level: O2

void Acec_ManDerive_rec(Gia_Man_t *pNew,Gia_Man_t *p,int Node,Vec_Int_t *vMirrors)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  Gia_Obj_t *pGVar8;
  Gia_Obj_t *pObj;
  ulong uVar9;
  ulong uVar10;
  
  iVar1 = Vec_IntEntry(vMirrors,Node);
  iVar2 = Node;
  if (-1 < iVar1) {
    iVar2 = Vec_IntEntry(vMirrors,Node);
    iVar2 = Abc_Lit2Var(iVar2);
  }
  pGVar8 = Gia_ManObj(p,iVar2);
  uVar6 = pGVar8->Value;
  if (uVar6 == 0xffffffff) {
    uVar6 = (uint)*(undefined8 *)pGVar8;
    if (((int)uVar6 < 0) || ((uVar6 & 0x1fffffff) == 0x1fffffff)) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecCl.c"
                    ,0x39,"void Acec_ManDerive_rec(Gia_Man_t *, Gia_Man_t *, int, Vec_Int_t *)");
    }
    Acec_ManDerive_rec(pNew,p,iVar2 - (uVar6 & 0x1fffffff),vMirrors);
    Acec_ManDerive_rec(pNew,p,iVar2 - (*(uint *)&pGVar8->field_0x4 & 0x1fffffff),vMirrors);
    uVar6 = (uint)*(undefined8 *)pGVar8;
    if (((~uVar6 & 0x1fffffff) == 0 || (int)uVar6 < 0) ||
       (((uint)((ulong)*(undefined8 *)pGVar8 >> 0x20) & 0x1fffffff) <= (uVar6 & 0x1fffffff))) {
      iVar1 = Gia_ObjFanin0Copy(pGVar8);
      iVar3 = Gia_ObjFanin1Copy(pGVar8);
      uVar6 = Gia_ManAppendAnd(pNew,iVar1,iVar3);
    }
    else {
      iVar1 = Gia_ObjFanin0Copy(pGVar8);
      iVar3 = Gia_ObjFanin1Copy(pGVar8);
      pObj = Gia_ManAppendObj(pNew);
      iVar4 = Abc_Lit2Var(iVar1);
      if (pNew->nObjs <= iVar4) {
        __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x2d4,"int Gia_ManAppendXorReal(Gia_Man_t *, int, int)");
      }
      iVar4 = Abc_Lit2Var(iVar3);
      if (pNew->nObjs <= iVar4) {
        __assert_fail("iLit1 >= 0 && Abc_Lit2Var(iLit1) < Gia_ManObjNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x2d5,"int Gia_ManAppendXorReal(Gia_Man_t *, int, int)");
      }
      iVar4 = Abc_Lit2Var(iVar1);
      iVar5 = Abc_Lit2Var(iVar3);
      if (iVar4 == iVar5) {
        __assert_fail("Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x2d6,"int Gia_ManAppendXorReal(Gia_Man_t *, int, int)");
      }
      uVar6 = Abc_Lit2Var(iVar1);
      uVar7 = Abc_Lit2Var(iVar3);
      iVar4 = Gia_ObjId(pNew,pObj);
      iVar5 = Abc_Lit2Var(iVar1);
      uVar9 = (ulong)(iVar4 - iVar5 & 0x1fffffff);
      if (uVar7 < uVar6) {
        *(ulong *)pObj = *(ulong *)pObj & 0xffffffffe0000000 | uVar9;
        iVar1 = Abc_LitIsCompl(iVar1);
        *(ulong *)pObj = *(ulong *)pObj & 0xffffffffdfffffff | (ulong)(uint)(iVar1 << 0x1d);
        iVar1 = Gia_ObjId(pNew,pObj);
        iVar4 = Abc_Lit2Var(iVar3);
        *(ulong *)pObj =
             *(ulong *)pObj & 0xe0000000ffffffff | (ulong)(iVar1 - iVar4 & 0x1fffffff) << 0x20;
        uVar6 = Abc_LitIsCompl(iVar3);
        uVar9 = (ulong)uVar6 << 0x3d;
        uVar10 = 0xdfffffffffffffff;
      }
      else {
        *(ulong *)pObj = *(ulong *)pObj & 0xe0000000ffffffff | uVar9 << 0x20;
        uVar6 = Abc_LitIsCompl(iVar1);
        *(ulong *)pObj = *(ulong *)pObj & 0xdfffffffffffffff | (ulong)uVar6 << 0x3d;
        iVar1 = Gia_ObjId(pNew,pObj);
        iVar4 = Abc_Lit2Var(iVar3);
        *(ulong *)pObj = *(ulong *)pObj & 0xffffffffe0000000 | (ulong)(iVar1 - iVar4 & 0x1fffffff);
        iVar1 = Abc_LitIsCompl(iVar3);
        uVar9 = (ulong)(uint)(iVar1 << 0x1d);
        uVar10 = 0xffffffffdfffffff;
      }
      *(ulong *)pObj = uVar10 & *(ulong *)pObj | uVar9;
      pNew->nXors = pNew->nXors + 1;
      iVar1 = Gia_ObjId(pNew,pObj);
      uVar6 = iVar1 * 2;
    }
    pGVar8->Value = uVar6;
  }
  if (iVar2 != Node) {
    iVar2 = Vec_IntEntry(vMirrors,Node);
    iVar2 = Abc_LitIsCompl(iVar2);
    uVar6 = Abc_LitNotCond(uVar6,iVar2);
    pGVar8 = Gia_ManObj(p,Node);
    pGVar8->Value = uVar6;
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////



////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Acec_ManDerive_rec( Gia_Man_t * pNew, Gia_Man_t * p, int Node, Vec_Int_t * vMirrors )
{
    Gia_Obj_t * pObj;
    int Obj = Node;
    if ( Vec_IntEntry(vMirrors, Node) >= 0 )
        Obj = Abc_Lit2Var( Vec_IntEntry(vMirrors, Node) );
    pObj = Gia_ManObj( p, Obj );
    if ( !~pObj->Value )
    {
        assert( Gia_ObjIsAnd(pObj) );
        Acec_ManDerive_rec( pNew, p, Gia_ObjFaninId0(pObj, Obj), vMirrors );
        Acec_ManDerive_rec( pNew, p, Gia_ObjFaninId1(pObj, Obj), vMirrors );
        if ( Gia_ObjIsXor(pObj) )
            pObj->Value = Gia_ManAppendXorReal( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else
            pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    }
    // set the original node as well
    if ( Obj != Node )
        Gia_ManObj(p, Node)->Value = Abc_LitNotCond( pObj->Value, Abc_LitIsCompl(Vec_IntEntry(vMirrors, Node)) );
}